

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O1

void rw::wdgl::instance(ObjPipeline *rwpipe,Atomic *atomic)

{
  uint uVar1;
  Geometry *pGVar2;
  code *pcVar3;
  AttribDesc *a;
  RGBA *pRVar4;
  InstanceDataHeader *pIVar5;
  undefined4 *puVar6;
  undefined8 uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  uint32 uVar11;
  V3d *pVVar12;
  uint8 *puVar13;
  TexCoords *src;
  AttribDesc *a_00;
  float32 f [4];
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  
  pGVar2 = atomic->geometry;
  if (pGVar2->instData == (InstanceDataHeader *)0x0) {
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/wdgl.cpp line: 330"
    ;
    pIVar5 = (InstanceDataHeader *)(*DAT_00149de8)(0x28,0x3000f);
    pGVar2->instData = pIVar5;
    pIVar5->platform = 0xb;
    *(undefined8 *)(pIVar5 + 8) = 0;
    iVar8 = (uint)(0 < pGVar2->numTexCoordSets) + rwpipe[1].super_Pipeline.pluginID;
    pIVar5[1].platform = iVar8 + 1;
    uVar1 = pGVar2->flags;
    if ((uVar1 & 8) != 0) {
      pIVar5[1].platform = iVar8 + 2;
    }
    if ((uVar1 & 0x10) != 0) {
      pIVar5[1].platform = pIVar5[1].platform + 1;
    }
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/wdgl.cpp line: 342"
    ;
    puVar6 = (undefined4 *)(*DAT_00149de8)((long)(int)pIVar5[1].platform * 0x18,0x3000f);
    *(undefined4 **)(pIVar5 + 2) = puVar6;
    *puVar6 = 0;
    puVar6[1] = 0;
    puVar6[2] = 0;
    puVar6[3] = 3;
    puVar6[5] = 0;
    if (pGVar2->numTexCoordSets == 0) {
      puVar6 = puVar6 + 6;
      iVar10 = 1;
      iVar8 = 0xc;
    }
    else {
      puVar6[6] = 1;
      puVar6[7] = 3;
      puVar6[8] = 0;
      puVar6[9] = 2;
      puVar6[0xb] = 0xc;
      puVar6 = puVar6 + 0xc;
      iVar10 = 2;
      iVar8 = 0x10;
    }
    uVar1 = pGVar2->flags;
    if ((uVar1 & 0x10) != 0) {
      *puVar6 = 2;
      puVar6[1] = 1;
      puVar6[2] = 1;
      puVar6[3] = 3;
      puVar6[5] = iVar8;
      iVar8 = iVar8 + 4;
      puVar6 = puVar6 + 6;
      iVar10 = iVar10 + 1;
    }
    if ((uVar1 & 8) != 0) {
      *puVar6 = 3;
      puVar6[1] = 2;
      puVar6[2] = 1;
      puVar6[3] = 4;
      puVar6[5] = iVar8;
      iVar8 = iVar8 + 4;
      iVar10 = iVar10 + 1;
    }
    pcVar3 = *(code **)&rwpipe[1].super_Pipeline.platform;
    if (pcVar3 == (code *)0x0) {
      uVar11 = pGVar2->numVertices * iVar8;
      pIVar5[4].platform = uVar11;
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/wdgl.cpp line: 393"
      ;
      uVar7 = (*DAT_00149de8)(uVar11,0x3000f);
      *(undefined8 *)(pIVar5 + 6) = uVar7;
    }
    else {
      iVar10 = (*pcVar3)(pGVar2,iVar10,iVar8);
      iVar8 = iVar8 + iVar10;
    }
    a = *(AttribDesc **)(pIVar5 + 2);
    uVar11 = pIVar5[1].platform;
    if (0 < (long)(int)uVar11) {
      lVar9 = 0;
      do {
        *(int *)((long)&a->stride + lVar9) = iVar8;
        lVar9 = lVar9 + 0x18;
      } while ((long)(int)uVar11 * 0x18 != lVar9);
    }
    if (0 < pGVar2->numVertices) {
      pVVar12 = pGVar2->morphTargets->vertices;
      puVar13 = (uint8 *)((ulong)a->offset + *(long *)(pIVar5 + 6));
      iVar8 = 0;
      do {
        packattrib(puVar13,&pVVar12->x,a,1.0);
        pVVar12 = pVVar12 + 1;
        puVar13 = puVar13 + a->stride;
        iVar8 = iVar8 + 1;
      } while (iVar8 < pGVar2->numVertices);
    }
    a_00 = a + 1;
    if (pGVar2->numTexCoordSets != 0) {
      if (0 < pGVar2->numVertices) {
        src = pGVar2->texCoords[0];
        puVar13 = (uint8 *)((ulong)a[1].offset + *(long *)(pIVar5 + 6));
        iVar8 = 0;
        do {
          packattrib(puVar13,&src->u,a_00,512.0);
          src = src + 1;
          puVar13 = puVar13 + a[1].stride;
          iVar8 = iVar8 + 1;
        } while (iVar8 < pGVar2->numVertices);
      }
      a_00 = a + 2;
    }
    if ((pGVar2->flags & 0x10) != 0) {
      if (0 < pGVar2->numVertices) {
        pVVar12 = pGVar2->morphTargets->normals;
        puVar13 = (uint8 *)((ulong)a_00->offset + *(long *)(pIVar5 + 6));
        iVar8 = 0;
        do {
          packattrib(puVar13,&pVVar12->x,a_00,1.0);
          pVVar12 = pVVar12 + 1;
          puVar13 = puVar13 + a_00->stride;
          iVar8 = iVar8 + 1;
        } while (iVar8 < pGVar2->numVertices);
      }
      a_00 = a_00 + 1;
    }
    if (((pGVar2->flags & 8) != 0) && (0 < pGVar2->numVertices)) {
      pRVar4 = pGVar2->colors;
      puVar13 = (uint8 *)((ulong)a_00->offset + *(long *)(pIVar5 + 6));
      lVar9 = 0;
      do {
        local_48 = (float)pRVar4[lVar9].red / 255.0;
        local_44 = (float)pRVar4[lVar9].green / 255.0;
        local_40 = (float)pRVar4[lVar9].blue / 255.0;
        local_3c = (float)pRVar4[lVar9].alpha / 255.0;
        packattrib(puVar13,(float32 *)&local_48,a_00,1.0);
        puVar13 = puVar13 + a_00->stride;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 < pGVar2->numVertices);
    }
  }
  return;
}

Assistant:

static void
instance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	// TODO: allow for REINSTANCE (or not, wdgl can't render)
	if(geo->instData)
		return;
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	geo->instData = header;
	header->platform = PLATFORM_WDGL;
	header->vbo = 0;
	header->ibo = 0;
	header->numAttribs =
		pipe->numCustomAttribs + 1 + (geo->numTexCoordSets > 0);
	if(geo->flags & Geometry::PRELIT)
		header->numAttribs++;
	if(geo->flags & Geometry::NORMALS)
		header->numAttribs++;
	int32 offset = 0;
	header->attribs = rwNewT(AttribDesc, header->numAttribs, MEMDUR_EVENT | ID_GEOMETRY);

	AttribDesc *a = header->attribs;
	// Vertices
	a->index = 0;
	a->type = 0;
	a->normalized = 0;
	a->size = 3;
	a->offset = offset;
	offset += 12;
	a++;
	int32 firstCustom = 1;

	// texCoords, only one set here
	if(geo->numTexCoordSets){
		a->index = 1;
		a->type = 3;
		a->normalized = 0;
		a->size = 2;
		a->offset = offset;
		offset += 4;
		a++;
		firstCustom++;
	}

	if(geo->flags & Geometry::NORMALS){
		a->index = 2;
		a->type = 1;
		a->normalized = 1;
		a->size = 3;
		a->offset = offset;
		offset += 4;
		a++;
		firstCustom++;
	}

	if(geo->flags & Geometry::PRELIT){
		a->index = 3;
		a->type = 2;
		a->normalized = 1;
		a->size = 4;
		a->offset = offset;
		offset += 4;
		a++;
		firstCustom++;
	}

	if(pipe->instanceCB)
		offset += pipe->instanceCB(geo, firstCustom, offset);
	else{
		header->dataSize = offset*geo->numVertices;
		header->data = rwNewT(uint8, header->dataSize, MEMDUR_EVENT | ID_GEOMETRY);
	}

	a = header->attribs;
	for(int32 i = 0; i < header->numAttribs; i++)
		a[i].stride = offset;

	uint8 *p = header->data + a->offset;
	V3d *vert = geo->morphTargets->vertices;
	for(int32 i = 0; i < geo->numVertices; i++){
		packattrib(p, (float32*)vert, a);
		vert++;
		p += a->stride;
	}
	a++;

	if(geo->numTexCoordSets){
		p = header->data + a->offset;
		TexCoords *texcoord = geo->texCoords[0];
		for(int32 i = 0; i < geo->numVertices; i++){
			packattrib(p, (float32*)texcoord, a, 512.0f);
			texcoord++;
			p += a->stride;
		}
		a++;
	}

	if(geo->flags & Geometry::NORMALS){
		p = header->data + a->offset;
		V3d *norm = geo->morphTargets->normals;
		for(int32 i = 0; i < geo->numVertices; i++){
			packattrib(p, (float32*)norm, a);
			norm++;
			p += a->stride;
		}
		a++;
	}

	if(geo->flags & Geometry::PRELIT){
		// TODO: this seems too complicated
		p = header->data + a->offset;
		RGBA *color = geo->colors;
		float32 f[4];
		for(int32 i = 0; i < geo->numVertices; i++){
			f[0] = color->red/255.0f;
			f[1] = color->green/255.0f;
			f[2] = color->blue/255.0f;
			f[3] = color->alpha/255.0f;
			packattrib(p, (float32*)f, a);
			color++;
			p += a->stride;
		}
		a++;
	}
}